

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::OurReader::readObject(OurReader *this,Token *tokenStart)

{
  TokenType TVar1;
  bool bVar2;
  _Elt_pointer ppVVar3;
  long *plVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  Value numberName;
  Token comma;
  string name;
  Token tokenName;
  Token colon;
  Value init;
  ValueHolder local_f0;
  long local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  string local_c8;
  string local_a8;
  Token local_88;
  Token local_70;
  Value local_58;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  Value::Value(&local_58,objectValue);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::swapPayload(ppVVar3[-1],&local_58);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::setOffsetStart(ppVVar3[-1],(long)tokenStart->start_ - (long)this->begin_);
  do {
    readToken(this,&local_88);
    while (TVar1 = local_88.type_, local_88.type_ == tokenComment) {
      readToken(this,&local_88);
    }
    if (local_88.type_ == tokenObjectEnd) {
      if (local_a8._M_string_length != 0) {
        *local_a8._M_dataplus._M_p = '\0';
LAB_004aac6c:
        local_a8._M_string_length = 0;
        local_f0.string_ = (char *)&local_e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"Missing \'}\' or object member name","");
        addError(this,(string *)&local_f0,&local_88,(Location)0x0);
        recoverFromError(this,tokenObjectEnd);
LAB_004aacae:
        if (local_f0 != &local_e0) {
          operator_delete(local_f0.string_,local_e0._M_allocated_capacity + 1);
        }
LAB_004aacc5:
        bVar2 = false;
        goto LAB_004aaccb;
      }
      break;
    }
    local_a8._M_string_length = 0;
    *local_a8._M_dataplus._M_p = '\0';
    if (TVar1 == tokenNumber) {
      if ((this->features_).allowNumericKeys_ != true) goto LAB_004aac6c;
      Value::Value((Value *)&local_f0,nullValue);
      bVar2 = decodeNumber(this,&local_88,(Value *)&local_f0);
      if (bVar2) {
        Value::asString_abi_cxx11_(&local_c8,(Value *)&local_f0);
        std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,(uint)local_c8._M_dataplus._M_p) !=
            &local_c8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_c8._M_dataplus._M_p._4_4_,(uint)local_c8._M_dataplus._M_p),
                          local_c8.field_2._M_allocated_capacity + 1);
        }
        Value::~Value((Value *)&local_f0);
        goto LAB_004aab57;
      }
      recoverFromError(this,tokenObjectEnd);
      Value::~Value((Value *)&local_f0);
      goto LAB_004aacc5;
    }
    if (TVar1 != tokenString) goto LAB_004aac6c;
    bVar2 = decodeString(this,&local_88,&local_a8);
    if (!bVar2) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_004aacc5;
    }
LAB_004aab57:
    readToken(this,&local_70);
    if (local_70.type_ != tokenMemberSeparator) {
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Missing \':\' after object member name","");
      addError(this,(string *)&local_f0,&local_70,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_004aacae;
    }
    if (0x3fffffff < local_a8._M_string_length) {
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"keylength >= 2^30","");
      throwRuntimeError((string *)&local_f0);
    }
    if ((this->features_).rejectDupKeys_ == true) {
      ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar3 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      bVar2 = Value::isMember(ppVVar3[-1],&local_a8);
      if (bVar2) {
        std::operator+(&local_c8,"Duplicate key: \'",&local_a8);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_f0.string_ = (char *)&local_e0;
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 == paVar5) {
          local_e0._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_e0._8_8_ = plVar4[3];
        }
        else {
          local_e0._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_f0.string_ = ((char *)*plVar4).string_;
        }
        local_e8 = plVar4[1];
        *plVar4 = (long)paVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,(uint)local_c8._M_dataplus._M_p) !=
            &local_c8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_c8._M_dataplus._M_p._4_4_,(uint)local_c8._M_dataplus._M_p),
                          local_c8.field_2._M_allocated_capacity + 1);
        }
        addError(this,(string *)&local_f0,&local_88,(Location)0x0);
        recoverFromError(this,tokenObjectEnd);
        goto LAB_004aacae;
      }
    }
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar3 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_f0.map_ = (ObjectValues *)Value::operator[](ppVVar3[-1],&local_a8);
    std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
              ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&local_f0.map_);
    bVar2 = readValue(this);
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
    if (!bVar2) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_004aacc5;
    }
    readToken(this,(Token *)&local_c8);
    if ((0xf < (uint)local_c8._M_dataplus._M_p) ||
       ((0xa004U >> ((uint)local_c8._M_dataplus._M_p & 0x1f) & 1) == 0)) {
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Missing \',\' or \'}\' in object declaration","");
      addError(this,(string *)&local_f0,(Token *)&local_c8,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_004aacae;
    }
    while ((uint)local_c8._M_dataplus._M_p == 0xf) {
      readToken(this,(Token *)&local_c8);
    }
  } while ((uint)local_c8._M_dataplus._M_p != 2);
  bVar2 = true;
LAB_004aaccb:
  Value::~Value(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool OurReader::readObject(Token& tokenStart) {
  Token tokenName;
  JSONCPP_STRING name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd && name.empty()) // empty object
      return true;
    name.clear();
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover(
          "Missing ':' after object member name", colon, tokenObjectEnd);
    }
    if (name.length() >= (1U<<30)) throwRuntimeError("keylength >= 2^30");
    if (features_.rejectDupKeys_ && currentValue().isMember(name)) {
      JSONCPP_STRING msg = "Duplicate key: '" + name + "'";
      return addErrorAndRecover(
          msg, tokenName, tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover(
          "Missing ',' or '}' in object declaration", comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover(
      "Missing '}' or object member name", tokenName, tokenObjectEnd);
}